

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O1

void __thiscall cursespp::Window::SetSize(Window *this,int width,int height)

{
  bool bVar1;
  
  if ((this->width == width) && (this->height == height)) {
    bVar1 = CheckForBoundsError(this);
    if (bVar1) {
      this->badBounds = true;
      (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x30])(this);
      return;
    }
    return;
  }
  this->width = width;
  this->height = height;
  RecreateForUpdatedDimensions(this);
  return;
}

Assistant:

void Window::SetSize(int width, int height) {
    ASSERT_MAIN_THREAD();

    if (this->width != width || this->height != height) {
        this->width = width;
        this->height = height;
        this->RecreateForUpdatedDimensions();
    }
    else {
        this->DestroyIfBadBounds();
    }
}